

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

int getPixelFormat(int pixelSize,int flags)

{
  int flags_local;
  int pixelSize_local;
  undefined4 local_4;
  
  if (pixelSize == 1) {
    local_4 = 6;
  }
  else if (pixelSize == 3) {
    if ((flags & 1U) == 0) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else if (pixelSize == 4) {
    if ((flags & 0x40U) == 0) {
      if ((flags & 1U) == 0) {
        local_4 = 2;
      }
      else {
        local_4 = 3;
      }
    }
    else if ((flags & 1U) == 0) {
      local_4 = 5;
    }
    else {
      local_4 = 4;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int getPixelFormat(int pixelSize, int flags)
{
  if (pixelSize == 1) return TJPF_GRAY;
  if (pixelSize == 3) {
    if (flags & TJ_BGR) return TJPF_BGR;
    else return TJPF_RGB;
  }
  if (pixelSize == 4) {
    if (flags & TJ_ALPHAFIRST) {
      if (flags & TJ_BGR) return TJPF_XBGR;
      else return TJPF_XRGB;
    } else {
      if (flags & TJ_BGR) return TJPF_BGRX;
      else return TJPF_RGBX;
    }
  }
  return -1;
}